

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paladin.c
# Opt level: O3

void spell_empathy(int level,int sn,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  if (ch == (CHAR_DATA *)vo) {
    txt = "You can not commune this on yourself.\n\r";
  }
  else {
    bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_empathy);
    if (!bVar1) {
      act("You touch your hand to $N\'s forehead and form a spiritual link.",ch,(void *)0x0,vo,3);
      act("$n touches $s hand to your forehead and forms a spiritual link.",ch,(void *)0x0,vo,2);
      act("$n touches $N on $S forehead forming a spiritual link.",ch,(void *)0x0,vo,0);
      init_affect(&local_90);
      local_90.level = ch->level;
      local_90.type = gsn_empathy;
      local_90.where = 0;
      local_90.aftype = 4;
      local_90.modifier = 0;
      local_90.duration = 0xc;
      local_90.location = 0;
      local_90.end_fun = empathy_end;
      local_90.owner = ch;
      affect_to_char((CHAR_DATA *)vo,&local_90);
      return;
    }
    txt = "They are already being empathized with.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_empathy(int level, int sn, CHAR_DATA *ch, void *vo, int target)
{
	AFFECT_DATA af;
	CHAR_DATA *vict = (CHAR_DATA *)vo;

	if (ch == vict)
	{
		send_to_char("You can not commune this on yourself.\n\r", ch);
		return;
	}

	if (is_affected(vict, gsn_empathy))
	{
		send_to_char("They are already being empathized with.\n\r", ch);
		return;
	}

	act("You touch your hand to $N's forehead and form a spiritual link.", ch, 0, vict, TO_CHAR);
	act("$n touches $s hand to your forehead and forms a spiritual link.", ch, 0, vict, TO_VICT);
	act("$n touches $N on $S forehead forming a spiritual link.", ch, 0, vict, TO_ROOM);

	init_affect(&af);
	af.owner = ch;
	af.level = ch->level;
	af.type = gsn_empathy;
	af.where = TO_AFFECTS;
	af.aftype = AFT_COMMUNE;
	af.location = APPLY_NONE;
	af.modifier = 0;
	af.duration = 12;
	af.end_fun = empathy_end;
	affect_to_char(vict, &af);
}